

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CastVerify.cpp
# Opt level: O1

void cast_verify::InitializeCastArray<float>(CastTest<float> *tests,size_t cTests)

{
  float *pfVar1;
  ulong uVar2;
  
  if (cTests != 0) {
    pfVar1 = (float *)&DAT_0014d440;
    uVar2 = 0;
    do {
      if (4 < uVar2) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/CastVerify.cpp"
                      ,0x32,
                      "void cast_verify::InitializeCastArray(CastTest<T> *, size_t) [T = float]");
      }
      tests[uVar2].x = *pfVar1;
      tests[uVar2].fExpected = SUB81(0x1010100L >> ((char)uVar2 * '\b' & 0x3fU),0);
      uVar2 = uVar2 + 1;
      pfVar1 = pfVar1 + 1;
    } while (cTests != uVar2);
  }
  return;
}

Assistant:

void InitializeCastArray(CastTest<T>* tests, size_t cTests)
	{
		for (unsigned long i = 0; i < cTests; ++i)
		{
			switch (i)
			{
			case 0:
				tests[i].x = static_cast<T>(pow(2, 64));
				tests[i].fExpected = false;
				break;
			case 1:
				tests[i].x = static_cast<T>(pow(2, 63));
				tests[i].fExpected = true;
				break;
			case 2:
				tests[i].x = 0;
				tests[i].fExpected = true;
				break;
			case 3:
				// This is peculiar, but (-0.0 < 0.0) == false
				tests[i].x = -0.0;
				tests[i].fExpected = true;
				break;
			case 4:
				tests[i].x = static_cast<T>(-0.01);
				tests[i].fExpected = false;
				break;
			default:
				assert(false);
				break;
			}
		}
	}